

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_sqrt_arm(floatx80 a,float_status *status)

{
  undefined1 auVar1 [12];
  ushort uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong b;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  uint aExp;
  uint64_t uVar14;
  bool bVar15;
  bool bVar16;
  floatx80 fVar17;
  floatx80 fVar18;
  ulong local_50;
  uint64_t term1;
  uint64_t local_40;
  uint64_t term0;
  
  uVar6 = a._8_8_;
  uVar5 = a.low;
  uVar2 = a.high;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar5 < 0)
  {
    if ((uVar2 & 0x7fff) == 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
        auVar1 = a._0_12_;
        fVar17._12_4_ = 0;
        fVar17.low = auVar1._0_8_;
        fVar17.high = auVar1._8_2_;
        fVar17._10_2_ = auVar1._10_2_;
        fVar17 = propagateFloatx80NaN_arm(a,fVar17,status);
        auVar1 = fVar17._0_12_;
LAB_0050ce5a:
        uVar5 = auVar1._0_8_;
        uVar6 = (ulong)auVar1._8_4_;
        goto LAB_0050ce5f;
      }
      uVar6 = CONCAT62(a._10_6_,0x7fff);
      if (-1 < (short)uVar2) goto LAB_0050ce5f;
    }
    else {
      if (-1 < (short)uVar2) {
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (uVar5 == 0) {
            uVar5 = 0;
            uVar6 = 0;
            goto LAB_0050ce5f;
          }
          uVar6 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar5 = uVar5 << ((byte)(uVar6 ^ 0x3f) & 0x3f);
          aExp = 1 - (int)(uVar6 ^ 0x3f);
        }
        else {
          aExp = (uint)(uVar2 & 0x7fff);
        }
        uVar3 = estimateSqrt32(aExp,(uint32_t)(uVar5 >> 0x20));
        bVar13 = (byte)aExp & 1 | 2;
        uVar9 = uVar5 >> bVar13;
        uVar5 = uVar5 << (-bVar13 & 0x3f);
        uVar4 = estimateDiv128To64(uVar9,uVar5,(ulong)uVar3 << 0x20);
        lVar12 = (ulong)uVar3 * 0x40000000;
        uVar14 = lVar12 + uVar4;
        mul64To128(uVar14,uVar14,&term0,&term1);
        uVar6 = uVar5 - term1;
        lVar12 = lVar12 + uVar4;
        uVar14 = uVar14 * 2;
        for (lVar10 = (uVar9 - term0) - (ulong)(uVar5 < term1); lVar12 = lVar12 + -1, lVar10 < 0;
            lVar10 = (lVar10 - (lVar12 >> 0x3f)) + (ulong)bVar15) {
          bVar15 = CARRY8(uVar6,uVar14 - 1);
          uVar6 = uVar6 + (uVar14 - 1);
          uVar14 = uVar14 - 2;
        }
        uVar4 = estimateDiv128To64(uVar6,0,uVar14);
        if ((uVar4 & 0x3ffffffffffffffe) < 6) {
          b = uVar4 + (uVar4 == 0);
          mul64To128(uVar14,b,&term1,&local_50);
          bVar15 = local_50 != 0;
          uVar9 = -local_50;
          mul64To128(b,b,&local_50,&local_40);
          uVar7 = uVar9 - local_50;
          uVar11 = -local_40;
          uVar8 = uVar7 - (local_40 != 0);
          uVar5 = b * 2 - 1;
          uVar4 = b;
          for (lVar12 = (((uVar6 - term1) - (ulong)bVar15) - (ulong)(uVar9 < local_50)) -
                        (ulong)(uVar7 < (local_40 != 0)); uVar4 = uVar4 - 1, lVar12 < 0;
              lVar12 = lVar12 + (ulong)bVar15 + (ulong)(uVar8 < bVar16)) {
            bVar15 = -((long)uVar4 >> 0x3f) + uVar8 + uVar14 < uVar8;
            uVar8 = -((long)uVar4 >> 0x3f) + uVar8 + (ulong)CARRY8(uVar5,uVar11) + uVar14;
            bVar16 = CARRY8(uVar11,uVar5);
            uVar11 = uVar11 + uVar5;
            b = b - 1;
            uVar5 = uVar5 - 2;
          }
          uVar4 = b | ((uVar8 != 0 || lVar12 != 0) || uVar11 != 0);
        }
        fVar17 = roundAndPackFloatx80_arm
                           (status->floatx80_rounding_precision,'\0',
                            ((int)(aExp - 0x3fff) >> 1) + 0x3fff,uVar14 - ((long)uVar4 >> 0x3f),
                            uVar4 * 2,status);
        auVar1 = fVar17._0_12_;
        goto LAB_0050ce5a;
      }
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar5 == 0)
      goto LAB_0050ce5f;
    }
  }
  uVar5 = 0xc000000000000000;
  status->float_exception_flags = status->float_exception_flags | 1;
  uVar6 = CONCAT62((int6)(uVar6 >> 0x10),0xffff);
LAB_0050ce5f:
  fVar18._8_8_ = uVar6 & 0xffffffff;
  fVar18.low = uVar5;
  return fVar18;
}

Assistant:

floatx80 floatx80_sqrt(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig0 << 1)) {
            return propagateFloatx80NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( aSig0 == 0 ) return packFloatx80( 0, 0, 0 );
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFF;
    zSig0 = estimateSqrt32( aExp, aSig0>>32 );
    shift128Right( aSig0, 0, 2 + ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & UINT64_C(0x3FFFFFFFFFFFFFFF) ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shortShift128Left( 0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= doubleZSig0;
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                0, zExp, zSig0, zSig1, status);
}